

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_strong_sensor_bc
          (REF_GRID ref_grid,REF_DBL *scalar,REF_DBL strong_value,REF_DICT ref_dict_bcs)

{
  REF_CELL pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_BOOL RVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  REF_INT bc;
  REF_INT nodes [27];
  REF_INT local_c0;
  uint local_bc;
  REF_DBL local_b8;
  REF_GRID local_b0;
  REF_INT local_a8 [30];
  
  local_b8 = strong_value;
  if (ref_grid->twod == 0) {
    pRVar1 = ref_grid->cell[3];
    local_b0 = ref_grid;
    for (iVar7 = 0; iVar7 < pRVar1->max; iVar7 = iVar7 + 1) {
      RVar2 = ref_cell_nodes(pRVar1,iVar7,local_a8);
      if (RVar2 == 0) {
        local_c0 = -1;
        uVar3 = ref_dict_value(ref_dict_bcs,local_a8[pRVar1->node_per],&local_c0);
        if ((uVar3 != 0) && (uVar3 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x547,"ref_phys_strong_sensor_bc",(ulong)uVar3,"bc");
          local_bc = uVar3;
        }
        if ((uVar3 != 5) && (uVar3 != 0)) {
          return local_bc;
        }
        RVar4 = ref_phys_wall_distance_bc(local_c0);
        if (RVar4 != 0) {
          uVar5 = (ulong)(uint)pRVar1->node_per;
          if (pRVar1->node_per < 1) {
            uVar5 = 0;
          }
          for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            scalar[local_a8[uVar6]] = local_b8;
          }
        }
      }
    }
    pRVar1 = local_b0->cell[6];
    for (iVar7 = 0; iVar7 < pRVar1->max; iVar7 = iVar7 + 1) {
      RVar2 = ref_cell_nodes(pRVar1,iVar7,local_a8);
      if (RVar2 == 0) {
        local_c0 = -1;
        uVar3 = ref_dict_value(ref_dict_bcs,local_a8[pRVar1->node_per],&local_c0);
        if ((uVar3 != 0) && (uVar3 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x552,"ref_phys_strong_sensor_bc",(ulong)uVar3,"bc");
          local_bc = uVar3;
        }
        if ((uVar3 != 5) && (uVar3 != 0)) {
          return local_bc;
        }
        RVar4 = ref_phys_wall_distance_bc(local_c0);
        if (RVar4 != 0) {
          uVar5 = (ulong)(uint)pRVar1->node_per;
          if (pRVar1->node_per < 1) {
            uVar5 = 0;
          }
          for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            scalar[local_a8[uVar6]] = local_b8;
          }
        }
      }
    }
  }
  else {
    pRVar1 = ref_grid->cell[0];
    for (iVar7 = 0; iVar7 < pRVar1->max; iVar7 = iVar7 + 1) {
      RVar2 = ref_cell_nodes(pRVar1,iVar7,local_a8);
      if (RVar2 == 0) {
        local_c0 = -1;
        uVar3 = ref_dict_value(ref_dict_bcs,local_a8[pRVar1->node_per],&local_c0);
        if ((uVar3 != 0) && (uVar3 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x538,"ref_phys_strong_sensor_bc",(ulong)uVar3,"bc");
          local_bc = uVar3;
        }
        if ((uVar3 != 5) && (uVar3 != 0)) {
          return local_bc;
        }
        RVar4 = ref_phys_wall_distance_bc(local_c0);
        if (RVar4 != 0) {
          uVar5 = (ulong)(uint)pRVar1->node_per;
          if (pRVar1->node_per < 1) {
            uVar5 = 0;
          }
          for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            scalar[local_a8[uVar6]] = local_b8;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_strong_sensor_bc(REF_GRID ref_grid, REF_DBL *scalar,
                                             REF_DBL strong_value,
                                             REF_DICT ref_dict_bcs) {
  if (ref_grid_twod(ref_grid)) {
    REF_CELL ref_cell;
    REF_INT bc;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
    ref_cell = ref_grid_edg(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
  } else {
    REF_CELL ref_cell;
    REF_INT bc;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
    ref_cell = ref_grid_tri(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
    ref_cell = ref_grid_qua(ref_grid);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, nodes[ref_cell_id_index(ref_cell)], &bc),
          REF_NOT_FOUND, "bc");
      if (ref_phys_wall_distance_bc(bc)) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          scalar[nodes[cell_node]] = strong_value;
        }
      }
    }
  }
  return REF_SUCCESS;
}